

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string * vera::toString<double>(string *__return_storage_ptr__,double *_value,int _precision)

{
  ostringstream out;
  long local_198;
  long local_190 [2];
  uint auStack_180 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  *(long *)((long)local_190 + *(long *)(local_198 + -0x18)) = (long)_precision;
  std::ostream::_M_insert<double>(*_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& _value, int _precision) {
    std::ostringstream out;
    out << std::fixed << std::setprecision(_precision) << _value;
    return out.str();
}